

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blitter.cpp
# Opt level: O3

bool __thiscall Amiga::Blitter<true>::advance_dma<true>(Blitter<true> *this)

{
  undefined1 *puVar1;
  int *piVar2;
  unsigned_short uVar3;
  ushort b;
  int iVar4;
  Phase PVar5;
  uint uVar6;
  undefined8 in_RAX;
  pair<Amiga::BlitterSequencer::Channel,_int> pVar7;
  uint uVar8;
  long lVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  uint16_t output;
  undefined8 local_28;
  
  if (this->height_ == 0) {
    return false;
  }
  if ((this->height_ == 0x20) && (*(int *)&(this->super_DMADevice<4UL,_4UL>).field_0x44 == 8)) {
    printf("Accelerating %d x %d\n",8,0x20);
    while (this->height_ != 0) {
      advance_dma<false>(this);
    }
    return true;
  }
  local_28 = in_RAX;
  if (this->line_mode_ != true) {
    if (this->busy_ == false) {
      (this->sequencer_).next_phase_ = Ongoing;
      (this->sequencer_).index_ = 0;
      (this->sequencer_).loop_ = 0;
      (this->sequencer_).phase_ = Ongoing;
      this->a32_ = 0;
      this->b32_ = 0;
      this->x_ = 0;
      this->loop_index_ = -1;
      this->write_phase_ = Starting;
      this->y_ = 0;
      this->not_zero_flag_ = false;
      this->busy_ = true;
    }
    pVar7 = BlitterSequencer::next(&this->sequencer_);
    if (this->loop_index_ != pVar7.second) {
      iVar4 = this->x_;
      this->transient_a_mask_ = -(ushort)(iVar4 != 0) | this->a_mask_[0];
      if ((iVar4 == 0) && (this->y_ != 0)) {
        add_modulos(this);
        iVar4 = this->x_;
      }
      this->x_ = iVar4 + 1;
      if (iVar4 + 1 == *(int *)&(this->super_DMADevice<4UL,_4UL>).field_0x44) {
        this->transient_a_mask_ = this->transient_a_mask_ & this->a_mask_[1];
        this->x_ = 0;
        iVar4 = this->y_ + 1;
        this->y_ = iVar4;
        if (iVar4 == this->height_) {
          uVar12 = (this->sequencer_).control_;
          PVar5 = PauseAndComplete;
          if ((uVar12 | 2) != 0xb) {
            PVar5 = (uVar12 != 0xd) + PauseAndComplete;
          }
          (this->sequencer_).next_phase_ = PVar5;
        }
      }
      this->loop_index_ = this->loop_index_ + 1;
    }
    switch(pVar7.first) {
    case FlushPipeline:
      goto switchD_0020c8fc_caseD_1;
    case C:
      this->c_data_ =
           (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
           [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ &
            *(uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x1c];
      local_28 = CONCAT44(local_28._4_4_,3);
      std::
      vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>::
      emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                  *)&this->transactions_,(Type *)&local_28,
                 (uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x1c,&this->c_data_);
      puVar1 = &(this->super_DMADevice<4UL,_4UL>).field_0x1c;
      *(uint32_t *)puVar1 = *(int *)puVar1 + this->direction_;
      return true;
    case B:
      this->b_data_ =
           (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
           [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ &
            *(uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x18];
      local_28 = CONCAT44(local_28._4_4_,2);
      std::
      vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>::
      emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                  *)&this->transactions_,(Type *)&local_28,
                 (uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x18,&this->b_data_);
      puVar1 = &(this->super_DMADevice<4UL,_4UL>).field_0x18;
      *(uint32_t *)puVar1 = *(int *)puVar1 + this->direction_;
      return true;
    case A:
      this->a_data_ =
           (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
           [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ &
            *(uint *)&(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14];
      local_28 = CONCAT44(local_28._4_4_,1);
      std::
      vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>::
      emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                  *)&this->transactions_,(Type *)&local_28,
                 (uint *)&(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14,
                 &this->a_data_);
      puVar1 = &(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14;
      *(uint32_t *)puVar1 = *(int *)puVar1 + this->direction_;
      return true;
    case None:
      local_28 = (ulong)local_28._4_4_ << 0x20;
      std::
      vector<Amiga::Blitter<true>::Transaction,_std::allocator<Amiga::Blitter<true>::Transaction>_>
      ::emplace_back<Amiga::Blitter<true>::Transaction::Type>
                (&this->transactions_,(Type *)&local_28);
      return false;
    default:
      uVar6 = (uint)(this->transient_a_mask_ & this->a_data_) | this->a32_ << 0x10;
      this->a32_ = uVar6;
      uVar12 = this->b32_ << 0x10 | (uint)this->b_data_;
      this->b32_ = uVar12;
      bVar13 = (byte)this->shifts_[0];
      if (this->one_dot_ == false) {
        uVar3 = (unsigned_short)(uVar6 >> (bVar13 & 0x1f));
        b = (ushort)(uVar12 >> ((byte)this->shifts_[1] & 0x1f));
      }
      else {
        bVar13 = bVar13 & 0x1f;
        uVar3 = (ushort)(uVar6 << bVar13) | (ushort)(uVar6 >> 0x20 - bVar13);
        bVar13 = (byte)this->shifts_[1] & 0x1f;
        b = this->b_data_ << bVar13 | (ushort)(uVar12 >> 0x20 - bVar13);
      }
      uVar3 = apply_minterm<unsigned_short>(uVar3,b,this->c_data_,(uint)this->minterms_);
      uVar12 = (uint)uVar3;
      uVar6 = 0x20;
      if ((this->exclusive_fill_ != false) || (uVar6 = 0, this->inclusive_fill_ == true)) {
        bVar13 = this->fill_carry_;
        uVar8 = 0xfffffffc;
        uVar11 = 0;
        do {
          uVar8 = uVar8 + 4;
          uVar11 = uVar11 | (*(uint *)((anonymous_namespace)::fill_values +
                                      (ulong)(((uint)bVar13 << 4 | uVar6 | uVar12 & 0xf) >> 3) * 4)
                             >> ((char)uVar12 * '\x04' & 0x1fU) & 0xf) << ((byte)uVar8 & 0x1f);
          uVar3 = (unsigned_short)uVar11;
          bVar13 = (0x96696996U >> ((uint)bVar13 << 4 & 0x1f | uVar12 & 0xf) & 1) != 0;
          uVar12 = uVar12 >> 4;
        } while (uVar8 < 0xc);
        this->fill_carry_ = (bool)bVar13;
      }
      this->not_zero_flag_ = this->not_zero_flag_ != false || uVar3 != 0;
      if (this->write_phase_ != Starting) {
        if (this->write_phase_ != Full) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Blitter.cpp"
                        ,0x22f,
                        "bool Amiga::Blitter<true>::advance_dma() [record_bus = true, complete_immediately = true]"
                       );
        }
        local_28 = CONCAT44(local_28._4_4_,5);
        std::
        vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
        ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                  ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                    *)&this->transactions_,(Type *)&local_28,&this->write_address_,
                   &this->write_value_);
        (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
        [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ & this->write_address_] =
             this->write_value_;
      }
      this->write_phase_ = Full;
      this->write_address_ = *(uint32_t *)&(this->super_DMADevice<4UL,_4UL>).field_0x20;
      this->write_value_ = uVar3;
      local_28 = CONCAT44(local_28._4_4_,4);
      std::
      vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>::
      emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                  *)&this->transactions_,(Type *)&local_28,&this->write_address_,&this->write_value_
                );
      puVar1 = &(this->super_DMADevice<4UL,_4UL>).field_0x20;
      *(uint32_t *)puVar1 = *(int *)puVar1 + this->direction_;
      return true;
    }
  }
  this->not_zero_flag_ = false;
  if (this->b_data_ != 0xffff) {
    __assert_fail("b_data_ == 0xffff",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Amiga/Blitter.cpp"
                  ,0x109,
                  "bool Amiga::Blitter<true>::advance_dma() [record_bus = true, complete_immediately = true]"
                 );
  }
  if (this->busy_ == false) {
    this->error_ = (*(int *)&(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.field_0x14 <<
                   0x11) >> 0x11;
    this->draw_ = true;
    this->has_c_data_ = false;
    this->busy_ = true;
LAB_0020c9a1:
    if (this->has_c_data_ == false) {
      this->has_c_data_ = true;
      this->c_data_ =
           (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
           [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ &
            *(uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x20];
      local_28._4_4_ = (uint)((ulong)in_RAX >> 0x20);
      local_28 = CONCAT44(local_28._4_4_,3);
      std::
      vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>::
      emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
                ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                  *)&this->transactions_,(Type *)&local_28,
                 (uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x20,&this->c_data_);
      return true;
    }
    uVar3 = apply_minterm<unsigned_short>
                      (this->a_data_ >> ((byte)this->shifts_[0] & 0x1f),0xffff,this->c_data_,
                       (uint)this->minterms_);
    local_28 = CONCAT26(uVar3,(undefined6)local_28);
    (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
    [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ &
     *(uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x20] = uVar3;
    this->not_zero_flag_ = this->not_zero_flag_ != false || uVar3 != 0;
    this->draw_ = (bool)(this->draw_ & (this->one_dot_ ^ 1U));
    this->has_c_data_ = false;
    local_28 = CONCAT44(local_28._4_4_,5);
    std::vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
    ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short_const&>
              ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                *)&this->transactions_,(Type *)&local_28,
               (uint *)&(this->super_DMADevice<4UL,_4UL>).field_0x20,
               (unsigned_short *)((long)&local_28 + 6));
    bVar10 = true;
  }
  else {
    if ((this->draw_ & 1U) != 0) goto LAB_0020c9a1;
    bVar10 = false;
  }
  uVar12 = this->line_direction_;
  iVar4 = this->error_;
  if ((uVar12 & 4) == 0) {
    uVar6 = (uint)((uVar12 & 1) == 0) * 4 + 4;
    if (iVar4 < 0) goto LAB_0020caad;
    uVar12 = ((uVar12 & 2) == 0) + 1;
LAB_0020caa4:
    uVar6 = uVar6 | uVar12;
    lVar9 = 0x24;
  }
  else {
    uVar6 = 2 - (uVar12 & 1);
    if (-1 < iVar4) {
      uVar12 = (uint)((uVar12 & 2) == 0) * 4 + 4;
      goto LAB_0020caa4;
    }
LAB_0020caad:
    lVar9 = 0x28;
  }
  this->error_ = iVar4 + *(int *)((long)(this->super_DMADevice<4UL,_4UL>).modulos_._M_elems +
                                 lVar9 + -0x24);
  if ((uVar6 & 1) == 0) {
    uVar12 = this->shifts_[0];
    if (((uVar6 & 2) != 0) && (uVar12 = uVar12 + 1, uVar12 == 0x10)) {
      iVar4 = 1;
      uVar8 = 0;
LAB_0020caeb:
      uVar12 = uVar8;
      puVar1 = &(this->super_DMADevice<4UL,_4UL>).field_0x20;
      *(int *)puVar1 = *(int *)puVar1 + iVar4;
    }
  }
  else {
    iVar4 = -1;
    uVar12 = this->shifts_[0] - 1;
    uVar8 = 0xffffffff;
    if (this->shifts_[0] == 0) goto LAB_0020caeb;
  }
  this->shifts_[0] = uVar12 & 0xf;
  if ((uVar6 & 4) == 0) {
    if ((uVar6 & 8) == 0) goto LAB_0020cb10;
    puVar1 = &(this->super_DMADevice<4UL,_4UL>).field_0x20;
    *(uint *)puVar1 = *(int *)puVar1 + (this->super_DMADevice<4UL,_4UL>).modulos_._M_elems[2];
  }
  else {
    puVar1 = &(this->super_DMADevice<4UL,_4UL>).field_0x20;
    *(uint *)puVar1 = *(int *)puVar1 - (this->super_DMADevice<4UL,_4UL>).modulos_._M_elems[2];
  }
  this->draw_ = true;
LAB_0020cb10:
  piVar2 = &this->height_;
  *piVar2 = *piVar2 + -1;
  if (*piVar2 == 0) {
    this->busy_ = false;
    DMADeviceBase::posit_interrupt((DMADeviceBase *)this,0x40);
  }
  return bVar10;
switchD_0020c8fc_caseD_1:
  add_modulos(this);
  DMADeviceBase::posit_interrupt((DMADeviceBase *)this,0x40);
  this->height_ = 0;
  this->busy_ = false;
  if (this->write_phase_ == Full) {
    local_28 = CONCAT44(local_28._4_4_,5);
    std::vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
    ::emplace_back<Amiga::Blitter<true>::Transaction::Type,unsigned_int&,unsigned_short&>
              ((vector<Amiga::Blitter<true>::Transaction,std::allocator<Amiga::Blitter<true>::Transaction>>
                *)&this->transactions_,(Type *)&local_28,&this->write_address_,&this->write_value_);
    (this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_
    [(this->super_DMADevice<4UL,_4UL>).super_DMADeviceBase.ram_mask_ & this->write_address_] =
         this->write_value_;
    this->write_phase_ = Starting;
    return true;
  }
  return true;
}

Assistant:

bool Blitter<record_bus>::advance_dma() {
	if(!height_) return false;

	// TODO: eliminate @c complete_immediately and this workaround.
	// See commentary in Chipset.cpp.
	if constexpr (complete_immediately) {

		// HACK! HACK!! HACK!!!
		//
		// This resolves an issue with loading the particular copy of Spindizzy Worlds
		// I am testing against.
		//
		// TODO: DO NOT PUBLISH THIS.
		//
		// This is committed solely so that I can continue researching the real, underlying
		// issue across machines. It would not be acceptable to me to ship this.
		// (and the printf is another reminder-to-self)
		if(width_ == 8 && height_ == 32) {
			printf("Accelerating %d x %d\n", width_, height_);

			while(get_status() & 0x4000) {
				advance_dma<false>();
			}
			return true;
		}
	}

	if(line_mode_) {
		not_zero_flag_ = false;

		// As-yet unimplemented:
		assert(b_data_ == 0xffff);

		//
		// Line mode.
		//

		// Bluffer's guide to line mode:
		//
		// In Bresenham terms, the following registers have been set up:
		//
		//	[A modulo] = 4 * (dy - dx)
		//	[B modulo] = 4 * dy
		//	[A pointer] = 4 * dy - 2 * dx, with the sign flag in BLTCON1 indicating sign.
		//
		//	[A data] = 0x8000
		//	[Both masks] = 0xffff
		//	[A shift] = x1 & 15
		//
		//	[B data] = texture
		//	[B shift] = bit at which to start the line texture (0 = LSB)
		//
		//	[C and D pointers] = word containing the first pixel of the line
		//	[C and D modulo] = width of the bitplane in bytes
		//
		//	height = number of pixels
		//
		//	If ONEDOT of BLTCON1 is set, plot only a single bit per horizontal row.
		//
		//	BLTCON1 quadrants are (bits 2–4):
		//
		//		110 -> step in x, x positive, y negative
		//		111 -> step in x, x negative, y negative
		//		101 -> step in x, x negative, y positive
		//		100 -> step in x, x positive, y positive
		//
		//		001 -> step in y, x positive, y negative
		//		011 -> step in y, x negative, y negative
		//		010 -> step in y, x negative, y positive
		//		000 -> step in y, x positive, y positive
		//
		//	So that's:
		//
		//		* bit 4 = x [=1] or y [=0] major;
		//		* bit 3 = 1 => major variable negative; otherwise positive;
		//		* bit 2 = 1 => minor variable negative; otherwise positive.

		//
		// Implementation below is heavily based on the documentation found
		// at https://github.com/niklasekstrom/blitter-subpixel-line/blob/master/Drawing%20lines%20using%20the%20Amiga%20blitter.pdf
		//

		//
		// Caveat: I've no idea how the DMA access slots should be laid out for
		// line drawing.
		//

		if(!busy_) {
			error_ = int16_t(pointer_[0] << 1) >> 1;	// TODO: what happens if line_sign_ doesn't agree with this?
			draw_ = true;
			busy_ = true;
			has_c_data_ = false;
		}

		bool did_output = false;
		if(draw_) {
			// TODO: patterned lines. Unclear what to do with the bit that comes out of b.
			// Probably extend it to a full word?

			if(!has_c_data_) {
				has_c_data_ = true;
				c_data_ = ram_[pointer_[3] & ram_mask_];
				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadC, pointer_[3], c_data_);
				}
				return true;
			}

			const uint16_t output =
				apply_minterm<uint16_t>(a_data_ >> shifts_[0], b_data_, c_data_, minterms_);
			ram_[pointer_[3] & ram_mask_] = output;
			not_zero_flag_ |= output;
			draw_ &= !one_dot_;
			has_c_data_ = false;
			did_output = true;
			if constexpr (record_bus) {
				transactions_.emplace_back(Transaction::Type::WriteFromPipeline, pointer_[3], output);
			}
		}

		constexpr int LEFT	= 1 << 0;
		constexpr int RIGHT	= 1 << 1;
		constexpr int UP	= 1 << 2;
		constexpr int DOWN	= 1 << 3;
		int step = (line_direction_ & 4) ?
			((line_direction_ & 1) ? LEFT : RIGHT) :
			((line_direction_ & 1) ? UP : DOWN);

		if(error_ < 0) {
			error_ += modulos_[1];
		} else {
			step |=
				(line_direction_ & 4) ?
					((line_direction_ & 2) ? UP : DOWN) :
					((line_direction_ & 2) ? LEFT : RIGHT);

			error_ += modulos_[0];
		}

		if(step & LEFT) {
			--shifts_[0];
			if(shifts_[0] == -1) {
				--pointer_[3];
			}
		} else if(step & RIGHT) {
			++shifts_[0];
			if(shifts_[0] == 16) {
				++pointer_[3];
			}
		}
		shifts_[0] &= 15;

		if(step & UP) {
			pointer_[3] -= modulos_[2];
			draw_ = true;
		} else if(step & DOWN) {
			pointer_[3] += modulos_[2];
			draw_ = true;
		}

		--height_;
		if(!height_) {
			busy_ = false;
			posit_interrupt(InterruptFlag::Blitter);
		}

		return did_output;
	} else {
		// Copy mode.
		if(!busy_) {
			sequencer_.begin();
			a32_ = 0;
			b32_ = 0;

			y_ = 0;
			x_ = 0;
			loop_index_ = -1;
			write_phase_ = WritePhase::Starting;
			not_zero_flag_ = false;
			busy_ = true;
		}

		const auto next = sequencer_.next();

		// If this is the start of a new iteration, check for end of line,
		// or of blit, and pick an appropriate mask for A based on location.
		if(next.second != loop_index_) {
			transient_a_mask_ = x_ ? 0xffff : a_mask_[0];

			// Check whether an entire row was completed in the previous iteration.
			// If so then add modulos. Though this won't capture the move off the
			// final line, so that's handled elsewhere.
			if(!x_ && y_) {
				add_modulos();
			}

			++x_;
			if(x_ == width_) {
				transient_a_mask_ &= a_mask_[1];
				x_ = 0;
				++y_;
				if(y_ == height_) {
					sequencer_.complete();
				}
			}
			++loop_index_;
		}

		using Channel = BlitterSequencer::Channel;
		switch(next.first) {
			case Channel::A:
				a_data_ = ram_[pointer_[0] & ram_mask_];

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadA, pointer_[0], a_data_);
				}
				pointer_[0] += direction_;
			return true;
			case Channel::B:
				b_data_ = ram_[pointer_[1] & ram_mask_];

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadB, pointer_[1], b_data_);
				}
				pointer_[1] += direction_;
			return true;
			case Channel::C:
				c_data_ = ram_[pointer_[2] & ram_mask_];

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::ReadC, pointer_[2], c_data_);
				}
				pointer_[2] += direction_;
			return true;
			case Channel::FlushPipeline:
				add_modulos();
				posit_interrupt(InterruptFlag::Blitter);
				height_ = 0;
				busy_ = false;

				if(write_phase_ == WritePhase::Full) {
					if constexpr (record_bus) {
						transactions_.emplace_back(Transaction::Type::WriteFromPipeline, write_address_, write_value_);
					}
					ram_[write_address_ & ram_mask_] = write_value_;
					write_phase_ = WritePhase::Starting;
				}
			return true;

			case Channel::None:
				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::SkippedSlot);
				}
			return false;

			case Channel::Write:	break;
		}

		a32_ = (a32_ << 16) | (a_data_ & transient_a_mask_);
		b32_ = (b32_ << 16) | b_data_;

		uint16_t a, b;

		// The barrel shifter shifts to the right in ascending address mode,
		// but to the left otherwise.
		if(!one_dot_) {
			a = uint16_t(a32_ >> shifts_[0]);
			b = uint16_t(b32_ >> shifts_[1]);
		} else {
			// TODO: there must be a neater solution than this.
			a = uint16_t(
				(a32_ << shifts_[0]) |
				(a32_ >> (32 - shifts_[0]))
			);

			b = uint16_t(
				(b32_ << shifts_[1]) |
				(b32_ >> (32 - shifts_[1]))
			);
		}

		uint16_t output =
			apply_minterm<uint16_t>(
				a,
				b,
				c_data_,
				minterms_);

		if(exclusive_fill_ || inclusive_fill_) {
			// Use the fill tables nibble-by-nibble to figure out the filled word.
			uint16_t fill_output = 0;
			int ongoing_carry = fill_carry_;
			const int type_mask = exclusive_fill_ ? (1 << 5) : 0;
			for(int c = 0; c < 16; c += 4) {
				const int total_index = (output & 0xf) | (ongoing_carry << 4) | type_mask;
				fill_output |= ((fill_values[total_index >> 3] >> ((total_index & 7) * 4)) & 0xf) << c;
				ongoing_carry = (fill_carries[total_index >> 5] >> (total_index & 31)) & 1;
				output >>= 4;
			}

			output = fill_output;
			fill_carry_ = ongoing_carry;
		}

		not_zero_flag_ |= output;

		switch(write_phase_) {
			case WritePhase::Full:
				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::WriteFromPipeline, write_address_, write_value_);
				}
				ram_[write_address_ & ram_mask_] = write_value_;
				[[fallthrough]];

			case WritePhase::Starting:
				write_phase_ = WritePhase::Full;
				write_address_ = pointer_[3];
				write_value_ = output;

				if constexpr (record_bus) {
					transactions_.emplace_back(Transaction::Type::AddToPipeline, write_address_, write_value_);
				}
				pointer_[3] += direction_;
			return true;

			default: assert(false);
		}
	}

	return true;
}